

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O3

BindResult __thiscall
QOpenGLTextureCache::bindTexture
          (QOpenGLTextureCache *this,QOpenGLContext *context,qint64 key,QImage *image,
          BindOptions options)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  qsizetype qVar4;
  QOpenGLCachedTexture *this_00;
  long in_FS_OFFSET;
  GLuint id;
  unsigned_long_long local_48;
  GLuint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  plVar3 = (long *)QOpenGLContext::functions();
  (**(code **)(*plVar3 + 0xa8))(1,&local_3c);
  (**(code **)*plVar3)(0xde1,local_3c);
  qVar4 = QOpenGLTextureUploader::textureImage(0xde1,image,options,(QSize)0xffffffffffffffff);
  local_48 = key;
  this_00 = (QOpenGLCachedTexture *)operator_new(0x10);
  QOpenGLCachedTexture::QOpenGLCachedTexture(this_00,local_3c,options,context);
  iVar1 = (int)qVar4;
  iVar2 = iVar1 + 0x3ff;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  QCache<unsigned_long_long,_QOpenGLCachedTexture>::insert
            (&this->m_cache,&local_48,this_00,(long)(iVar2 >> 10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (BindResult)((ulong)local_3c | 0x100000000);
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLTextureCache::BindResult QOpenGLTextureCache::bindTexture(QOpenGLContext *context,
                                                                 qint64 key,
                                                                 const QImage &image,
                                                                 QOpenGLTextureUploader::BindOptions options)
{
    Q_TRACE_SCOPE(QOpenGLTextureCache_bindTexture, context, key, image.bits(), options);

    GLuint id;
    QOpenGLFunctions *funcs = context->functions();
    funcs->glGenTextures(1, &id);
    funcs->glBindTexture(GL_TEXTURE_2D, id);

    int cost = QOpenGLTextureUploader::textureImage(GL_TEXTURE_2D, image, options);

    m_cache.insert(key, new QOpenGLCachedTexture(id, options, context), cost / 1024);

    return { id, BindResultFlag::NewTexture };
}